

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O2

DdNode * Cudd_bddTransferPermute
                   (DdManager *ddSource,DdManager *ddDestination,DdNode *f,int *Permute)

{
  int *piVar1;
  int iVar2;
  st__table *table;
  DdNode *pDVar3;
  st__generator *gen;
  int *in_R8;
  DdNode *value;
  DdNode *key;
  DdNode *local_40;
  char *local_38;
  
  do {
    ddDestination->reordered = 0;
    table = st__init_table(st__ptrcmp,st__ptrhash);
    if (table == (st__table *)0x0) {
LAB_006945d4:
      pDVar3 = (DdNode *)0x0;
    }
    else {
      pDVar3 = cuddBddTransferPermuteRecur
                         (ddDestination,(DdManager *)f,(DdNode *)table,(st__table *)Permute,in_R8);
      if (pDVar3 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
      }
      gen = st__init_gen(table);
      if (gen == (st__generator *)0x0) {
        st__free_table(table);
        goto LAB_006945d4;
      }
      while (iVar2 = st__gen(gen,&local_38,(char **)&local_40), iVar2 != 0) {
        Cudd_RecursiveDeref(ddDestination,local_40);
      }
      st__free_gen(gen);
      st__free_table(table);
      if (pDVar3 == (DdNode *)0x0) goto LAB_006945d4;
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
    }
    if (ddDestination->reordered != 1) {
      return pDVar3;
    }
  } while( true );
}

Assistant:

DdNode *
Cudd_bddTransferPermute( DdManager * ddSource,
                  DdManager * ddDestination, DdNode * f, int * Permute )
{
    DdNode *res;
    do
    {
        ddDestination->reordered = 0;
        res = cuddBddTransferPermute( ddSource, ddDestination, f, Permute );
    }
    while ( ddDestination->reordered == 1 );
    return ( res );

}